

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O2

void write_colormap(j_decompress_ptr cinfo,bmp_dest_ptr dest,int map_colors,int map_entry_size)

{
  uint uVar1;
  JSAMPARRAY ppJVar2;
  FILE *__stream;
  jpeg_error_mgr *pjVar3;
  int __c;
  ulong uVar4;
  ulong uVar5;
  
  ppJVar2 = cinfo->colormap;
  __stream = (FILE *)(dest->pub).output_file;
  if (ppJVar2 == (JSAMPARRAY)0x0) {
    for (__c = 0; __c != 0x100; __c = __c + 1) {
      putc(__c,__stream);
      putc(__c,__stream);
      putc(__c,__stream);
      if (map_entry_size == 4) {
        putc(0,__stream);
      }
    }
    uVar4 = 0x100;
  }
  else {
    uVar1 = cinfo->actual_number_of_colors;
    if (cinfo->out_color_components == 3) {
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        putc((uint)ppJVar2[2][uVar5],__stream);
        putc((uint)ppJVar2[1][uVar5],__stream);
        putc((uint)(*ppJVar2)[uVar5],__stream);
        if (map_entry_size == 4) {
          putc(0,__stream);
        }
      }
    }
    else {
      uVar5 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        putc((uint)(*ppJVar2)[uVar5],__stream);
        putc((uint)(*ppJVar2)[uVar5],__stream);
        putc((uint)(*ppJVar2)[uVar5],__stream);
        if (map_entry_size == 4) {
          putc(0,__stream);
        }
      }
    }
  }
  if (map_colors < (int)uVar4) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x413;
    (pjVar3->msg_parm).i[0] = (int)uVar4;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  for (; (int)uVar4 < map_colors; uVar4 = (ulong)((int)uVar4 + 1)) {
    putc(0,__stream);
    putc(0,__stream);
    putc(0,__stream);
    if (map_entry_size == 4) {
      putc(0,__stream);
    }
  }
  return;
}

Assistant:

LOCAL(void)
write_colormap(j_decompress_ptr cinfo, bmp_dest_ptr dest, int map_colors,
               int map_entry_size)
{
  JSAMPARRAY colormap = cinfo->colormap;
  int num_colors = cinfo->actual_number_of_colors;
  FILE *outfile = dest->pub.output_file;
  int i;

  if (colormap != NULL) {
    if (cinfo->out_color_components == 3) {
      /* Normal case with RGB colormap */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[2][i], outfile);
        putc(colormap[1][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    } else {
      /* Grayscale colormap (only happens with grayscale quantization) */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    }
  } else {
    /* If no colormap, must be grayscale data.  Generate a linear "map". */
    for (i = 0; i < 256; i++) {
      putc(i, outfile);
      putc(i, outfile);
      putc(i, outfile);
      if (map_entry_size == 4)
        putc(0, outfile);
    }
  }
  /* Pad colormap with zeros to ensure specified number of colormap entries */
  if (i > map_colors)
    ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, i);
  for (; i < map_colors; i++) {
    putc(0, outfile);
    putc(0, outfile);
    putc(0, outfile);
    if (map_entry_size == 4)
      putc(0, outfile);
  }
}